

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_strl(char *data,uint32_t len)

{
  long lStack_8;
  
  if (len < 0x20) {
    *data = (byte)len | 0xa0;
    lStack_8 = 1;
  }
  else if (len < 0x100) {
    *data = -0x27;
    data[1] = (byte)len;
    lStack_8 = 2;
  }
  else if (len < 0x10000) {
    *data = -0x26;
    *(ushort *)(data + 1) = (ushort)len << 8 | (ushort)len >> 8;
    lStack_8 = 3;
  }
  else {
    *data = -0x25;
    *(uint32_t *)(data + 1) =
         len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    lStack_8 = 5;
  }
  return data + lStack_8;
}

Assistant:

MP_IMPL char *
mp_encode_strl(char *data, uint32_t len)
{
	if (len <= 31) {
		return mp_store_u8(data, 0xa0 | (uint8_t) len);
	} else if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xd9);
		return mp_store_u8(data, len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xda);
		return mp_store_u16(data, len);
	} else {
		data = mp_store_u8(data, 0xdb);
		return mp_store_u32(data, len);
	}
}